

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

Own<kj::(anonymous_namespace)::Nested> * __thiscall
kj::Own<kj::(anonymous_namespace)::Nested>::operator=
          (Own<kj::(anonymous_namespace)::Nested> *this,
          Own<kj::(anonymous_namespace)::Nested> *other)

{
  Disposer *this_00;
  Nested *object;
  Nested *ptrCopy;
  Disposer *disposerCopy;
  Own<kj::(anonymous_namespace)::Nested> *other_local;
  Own<kj::(anonymous_namespace)::Nested> *this_local;
  
  this_00 = this->disposer;
  object = this->ptr;
  this->disposer = other->disposer;
  this->ptr = other->ptr;
  other->ptr = (Nested *)0x0;
  if (object != (Nested *)0x0) {
    Disposer::dispose<kj::(anonymous_namespace)::Nested>(this_00,object);
  }
  return this;
}

Assistant:

inline Own& operator=(Own&& other) {
    // Move-assingnment operator.

    // Careful, this might own `other`.  Therefore we have to transfer the pointers first, then
    // dispose.
    const Disposer* disposerCopy = disposer;
    T* ptrCopy = ptr;
    disposer = other.disposer;
    ptr = other.ptr;
    other.ptr = nullptr;
    if (ptrCopy != nullptr) {
      disposerCopy->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
    return *this;
  }